

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O0

void GetEmpty(Pixel *pixel)

{
  Pixel *pixel_local;
  
  pixel->pixelType = Empty;
  (pixel->color).a = 0xff;
  (pixel->color).r = '\0';
  (pixel->color).g = '\0';
  (pixel->color).b = '\0';
  pixel->density = 0xffffffff;
  pixel->flameable = false;
  return;
}

Assistant:

void GetEmpty(struct Pixel* pixel) {
    pixel->pixelType = Empty;
    pixel->color.a = 255;
    pixel->color.r = 0;
    pixel->color.g = 0;
    pixel->color.b = 0;
    pixel->density = UINT32_MAX;
    pixel->flameable = false;
}